

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# keyword_validator.hpp
# Opt level: O1

walk_result __thiscall
jsoncons::jsonschema::
not_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
::do_validate(not_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
              *this,eval_context<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
                    *context,
             basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *instance,
             json_pointer *instance_location,evaluation_results *results,error_reporter *reporter,
             basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *patch)

{
  long *plVar1;
  int iVar2;
  walk_result wVar3;
  collecting_error_listener local_reporter;
  eval_context<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
  this_context;
  evaluation_results local_results;
  long *local_218 [2];
  long local_208 [2];
  undefined **local_1f8;
  undefined8 local_1f0;
  vector<jsoncons::jsonschema::validation_message,_std::allocator<jsoncons::jsonschema::validation_message>_>
  local_1e8;
  eval_context<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
  local_1d0;
  evaluation_results local_198;
  long *local_148 [2];
  long local_138 [2];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_128;
  long *local_110;
  long local_100 [16];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_80;
  long *local_68;
  long local_58 [2];
  vector<jsoncons::jsonschema::validation_message,_std::allocator<jsoncons::jsonschema::validation_message>_>
  local_48;
  
  eval_context<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
  ::eval_context(&local_1d0,context,
                 &(this->
                  super_keyword_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
                  ).
                  super_keyword_base<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
                  .keyword_name_);
  local_198.evaluated_properties._M_h._M_buckets =
       &local_198.evaluated_properties._M_h._M_single_bucket;
  local_198.evaluated_properties._M_h._M_bucket_count = 1;
  local_198.evaluated_properties._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_198.evaluated_properties._M_h._M_element_count = 0;
  local_198.evaluated_properties._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  local_198.evaluated_properties._M_h._M_rehash_policy._M_next_resize = 0;
  local_198.evaluated_properties._M_h._M_single_bucket = (__node_base_ptr)0x0;
  local_198.evaluated_items.ranges_.
  super__Vector_base<jsoncons::jsonschema::range,_std::allocator<jsoncons::jsonschema::range>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_198.evaluated_items.ranges_.
  super__Vector_base<jsoncons::jsonschema::range,_std::allocator<jsoncons::jsonschema::range>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_198.evaluated_items.ranges_.
  super__Vector_base<jsoncons::jsonschema::range,_std::allocator<jsoncons::jsonschema::range>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1f0 = 0;
  local_1f8 = &PTR__collecting_error_listener_00b67010;
  local_1e8.
  super__Vector_base<jsoncons::jsonschema::validation_message,_std::allocator<jsoncons::jsonschema::validation_message>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1e8.
  super__Vector_base<jsoncons::jsonschema::validation_message,_std::allocator<jsoncons::jsonschema::validation_message>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1e8.
  super__Vector_base<jsoncons::jsonschema::validation_message,_std::allocator<jsoncons::jsonschema::validation_message>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  plVar1 = *(long **)&(this->
                      super_keyword_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
                      ).field_0xe0;
  iVar2 = (**(code **)(*plVar1 + 0x28))
                    (plVar1,&local_1d0,instance,instance_location,&local_198,&local_1f8,patch);
  wVar3 = abort;
  if (iVar2 != 1) {
    if (local_1e8.
        super__Vector_base<jsoncons::jsonschema::validation_message,_std::allocator<jsoncons::jsonschema::validation_message>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        local_1e8.
        super__Vector_base<jsoncons::jsonschema::validation_message,_std::allocator<jsoncons::jsonschema::validation_message>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      local_218[0] = local_208;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_218,"Instance must not be valid against schema","");
      (*(this->
        super_keyword_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
        ).
        super_keyword_base<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
        .super_validation_message_factory._vptr_validation_message_factory[2])
                (local_148,this,&local_1d0.eval_path_,instance_location,local_218);
      reporter->error_count_ = reporter->error_count_ + 1;
      iVar2 = (*reporter->_vptr_error_reporter[2])(reporter,local_148);
      std::
      vector<jsoncons::jsonschema::validation_message,_std::allocator<jsoncons::jsonschema::validation_message>_>
      ::~vector(&local_48);
      if (local_68 != local_58) {
        operator_delete(local_68,local_58[0] + 1);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_80);
      if (local_110 != local_100) {
        operator_delete(local_110,local_100[0] + 1);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_128);
      if (local_148[0] != local_138) {
        operator_delete(local_148[0],local_138[0] + 1);
      }
      if (local_218[0] != local_208) {
        operator_delete(local_218[0],local_208[0] + 1);
      }
      if (iVar2 == 1) goto LAB_0047875f;
    }
    else {
      evaluation_results::merge(results,&local_198);
    }
    wVar3 = advance;
  }
LAB_0047875f:
  local_1f8 = &PTR__collecting_error_listener_00b67010;
  std::
  vector<jsoncons::jsonschema::validation_message,_std::allocator<jsoncons::jsonschema::validation_message>_>
  ::~vector(&local_1e8);
  if (local_198.evaluated_items.ranges_.
      super__Vector_base<jsoncons::jsonschema::range,_std::allocator<jsoncons::jsonschema::range>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_198.evaluated_items.ranges_.
                    super__Vector_base<jsoncons::jsonschema::range,_std::allocator<jsoncons::jsonschema::range>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_198.evaluated_items.ranges_.
                          super__Vector_base<jsoncons::jsonschema::range,_std::allocator<jsoncons::jsonschema::range>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_198.evaluated_items.ranges_.
                          super__Vector_base<jsoncons::jsonschema::range,_std::allocator<jsoncons::jsonschema::range>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                 *)&local_198);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_1d0.eval_path_.tokens_);
  if (local_1d0.dynamic_scope_.
      super__Vector_base<const_jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_*,_std::allocator<const_jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_*>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1d0.dynamic_scope_.
                    super__Vector_base<const_jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_*,_std::allocator<const_jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_*>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_1d0.dynamic_scope_.
                          super__Vector_base<const_jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_*,_std::allocator<const_jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_1d0.dynamic_scope_.
                          super__Vector_base<const_jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_*,_std::allocator<const_jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return wVar3;
}

Assistant:

walk_result do_validate(const eval_context<Json>& context, const Json& instance, 
            const jsonpointer::json_pointer& instance_location,
            evaluation_results& results, 
            error_reporter& reporter, 
            Json& patch) const final
        {
            eval_context<Json> this_context(context, this->keyword_name());

            evaluation_results local_results;
            collecting_error_listener local_reporter;
            walk_result result = schema_val_->validate(this_context, instance, instance_location, local_results, local_reporter, patch);
            if (result == walk_result::abort)
            {
                return result;
            }

            if (local_reporter.errors.empty())
            {
                result = reporter.error(this->make_validation_message(
                    this_context.eval_path(),
                    instance_location, 
                    "Instance must not be valid against schema"));
                if (result == walk_result::abort)
                {
                    return result;
                }
            }
            else
            {
                results.merge(local_results);
            }
            return walk_result::advance;
        }